

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndicesRef
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  Index IVar1;
  JointActionObservationHistory *pJVar2;
  ostream *poVar3;
  E *this_00;
  stringstream ss;
  ostream local_188 [376];
  
  if (jaohI < this->_m_nrJointActionObservationHistories) {
    IVar1 = Globals::CastLIndexToIndex(jaohI);
    pJVar2 = JointActionObservationHistoryTree::GetJointActionObservationHistory
                       ((this->_m_jointActionObservationHistoryTreeVector).
                        super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[IVar1]);
    return &pJVar2->_m_individualActionObservationHistories;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_188,"PlanningUnitMADPDiscrete::JointToIndividualActionActObserva");
  poVar3 = std::operator<<(poVar3,"tionHistory Indices ERROR: index (");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3,") out of bounds!");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

const vector<Index>&
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndicesRef(
        LIndex jaohI) const
{    
    if(jaohI < _m_nrJointActionObservationHistories)
    {
        JointActionObservationHistoryTree* jaoht = 
            _m_jointActionObservationHistoryTreeVector[CastLIndexToIndex(jaohI)];
        return(jaoht->GetJointActionObservationHistory()->
                GetIndividualActionObservationHistoryIndices());
    }
    else
    {
        stringstream ss;
        ss << "PlanningUnitMADPDiscrete::JointToIndividualActionActObserva"<<
            "tionHistory Indices ERROR: index ("<< jaohI <<
            ") out of bounds!"<<endl;
        throw E(ss); 
    }
}